

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O3

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
::run_impl(QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
           *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  size_t i_target_put_count_00;
  size_t i_target_consume_count;
  QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
  *pQVar1;
  long *plVar2;
  QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
  *pQVar3;
  int iVar4;
  ThreadData *thread;
  uint64_t uVar5;
  pointer pTVar6;
  int *piVar7;
  pointer __n;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer extraout_RDX_02;
  pointer __args;
  pointer extraout_RDX_03;
  void *__buf;
  void *__buf_00;
  ThreadData *thread_1;
  pointer pTVar8;
  ulong uVar9;
  uint64_t i_affinity_mask;
  long lVar10;
  __atomic_base<unsigned_long> _Var11;
  int64_t *__args_00;
  size_t sVar12;
  PutTypeCounters *counter;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  FeedBack feedback;
  aligned_vector<ThreadData>_conflict64 threads;
  long spawned;
  FinalStats final_state;
  histogram<long,_true> histogram_spawned;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  queue;
  histogram<long,_true> histogram_except_cons;
  histogram<long,_true> histogram_except_puts;
  ostream local_696;
  byte local_695;
  QueueTesterFlags local_694;
  QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
  *local_690;
  EasyRandom *local_688;
  QueueTesterFlags local_67c;
  size_t local_678;
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
  local_670;
  long local_658;
  long *local_650;
  undefined8 local_648;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined1 local_628 [376];
  pointer local_4b0;
  iterator local_4a8;
  long *local_4a0;
  __native_type local_480;
  undefined8 uStack_458;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_400;
  undefined1 local_3b8 [376];
  pointer local_240;
  iterator local_238;
  long *local_230;
  undefined1 local_218 [376];
  pointer local_a0;
  iterator local_98;
  long *local_90;
  
  lVar10 = *(long *)(this + 0x20);
  local_694 = i_flags;
  local_688 = i_random;
  local_67c = i_flags;
  if ((((*(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3 != lVar10) ||
       (*(long *)(this + 0x60) - *(long *)(this + 0x58) >> 3 != lVar10)) ||
      (*(long *)(this + 0x78) - *(long *)(this + 0x70) >> 3 != lVar10)) ||
     (*(long *)(this + 0x90) - *(long *)(this + 0x88) >> 3 != lVar10)) {
    detail::assert_failed<>
              ("m_put_cases.size() == case_count && m_consume_cases.size() == case_count && m_reentrant_put_cases.size() == case_count && m_reentrant_consume_cases.size() == case_count"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x75);
  }
  local_480.__data.__list.__next = (__pthread_internal_list *)0x0;
  uStack_458 = 0;
  local_480._16_8_ = 0;
  local_480.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_480.__align = 0;
  local_480._8_8_ = 0;
  local_440 = 0xffc0;
  local_438 = 0;
  local_400 = 0;
  local_670.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_670.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_670.
  super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_696 = (ostream)0x0;
  local_678 = i_target_put_count;
  std::
  vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
  ::reserve(&local_670,*(size_type *)(this + 0xa0));
  if (*(long *)(this + 0xa0) != 0) {
    uVar13 = 0;
    do {
      local_628._0_8_ = &local_696;
      std::
      vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::ThreadData>>
      ::
      emplace_back<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>const&,density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::FeedBack*,density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>&,density_tests::EasyRandom&,density_tests::QueueTesterFlags&>
                ((vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::ThreadData,density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::ThreadData>>
                  *)&local_670,
                 (QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
                  *)this,(FeedBack **)local_628,
                 (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                  *)&local_480.__data,local_688,&local_694);
      uVar13 = uVar13 + 1;
    } while (uVar13 < *(ulong *)(this + 0xa0));
  }
  local_690 = this;
  uVar5 = get_num_of_processors();
  uVar13 = *(ulong *)(local_690 + 0xa0);
  if (uVar13 != 0) {
    uVar14 = 0xfffffffffffffffe;
    if (3 < uVar5) {
      uVar14 = (ulong)((uint)((local_694 & eReserveCoreToMainThread) == eNone) * 2) |
               0xfffffffffffffffc;
    }
    lVar10 = 0;
    sVar12 = 0;
    do {
      uVar9 = uVar14;
      i_target_put_count_00 = 0;
      if (sVar12 == 0) {
        uVar9 = 1;
        i_target_put_count_00 = local_678;
      }
      i_target_consume_count = 0;
      if (sVar12 == uVar13 - 1) {
        uVar9 = 0;
        i_target_consume_count = local_678;
      }
      i_affinity_mask = uVar9 ^ 1L << ((char)uVar5 - 1U & 0x3f);
      if (uVar5 < 2) {
        i_affinity_mask = 0xffffffffffffffff;
      }
      ThreadData::start((ThreadData *)
                        ((long)((local_670.
                                 super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_random).m_rand._M_x +
                        lVar10 + -0x50),sVar12,i_target_put_count_00,i_target_consume_count,
                        i_affinity_mask);
      sVar12 = sVar12 + 1;
      uVar13 = *(ulong *)(local_690 + 0xa0);
      lVar10 = lVar10 + 0x1440;
    } while (sVar12 < uVar13);
  }
  LineUpdaterStreamAdapter::LineUpdaterStreamAdapter
            ((LineUpdaterStreamAdapter *)local_628,*(ostream **)local_690);
  Progress::Progress((Progress *)local_218,local_678);
  do {
    sVar12 = local_678;
    if (local_670.
        super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_670.
        super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var11._M_i = 0;
      uVar13 = 0;
    }
    else {
      uVar13 = 0;
      _Var11._M_i = 0;
      pTVar6 = local_670.
               super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar13 = uVar13 + (__int_type)
                          (((pTVar6->m_incremental_stats)._M_t.
                            super___uniq_ptr_impl<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                            .
                            super__Head_base<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_false>
                           ._M_head_impl)->m_produced).super___atomic_base<unsigned_long>;
        _Var11._M_i = _Var11._M_i +
                      (((pTVar6->m_incremental_stats)._M_t.
                        super___uniq_ptr_impl<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_std::default_delete<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats>_>
                        .
                        super__Head_base<0UL,_density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::IncrementalStats_*,_false>
                       ._M_head_impl)->m_consumed).super___atomic_base<unsigned_long>._M_i;
        pTVar6 = pTVar6 + 1;
      } while (pTVar6 != local_670.
                         super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((local_678 < _Var11._M_i) || (local_678 < uVar13)) {
      detail::assert_failed<>
                ("consumed <= i_target_put_count && produced <= i_target_put_count",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                 ,0xd7);
    }
    local_695 = sVar12 <= uVar13;
    lVar10 = uVar13 - _Var11._M_i;
    if (uVar13 < _Var11._M_i || lVar10 == 0) {
      local_696 = (ostream)0x0;
    }
    else {
      auVar15._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar15._0_8_ = lVar10;
      auVar15._12_4_ = 0x45300000;
      auVar16._8_4_ = (int)(_Var11._M_i >> 0x20);
      auVar16._0_8_ = _Var11._M_i;
      auVar16._12_4_ = 0x45300000;
      local_696 = (ostream)(0.2 < ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                                  ((auVar16._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)_Var11._M_i) -
                                  4503599627370496.0)));
    }
    local_688._0_1_ = sVar12 <= _Var11._M_i;
    if ((local_694 & ePrintProgress) != eNone) {
      local_218._0_8_ = _Var11._M_i;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_628 + 0x28),"Active threads: ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_628 + 0x28));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_628 + 0x28),", Consumed: ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_628 + 0x28));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_628 + 0x28)," (",2);
      Progress::write_to_stream((Progress *)local_218,(ostream *)(local_628 + 0x28));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_628 + 0x28),"), enqueued: ",0xd);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_628 + 0x28));
      LineUpdaterStreamAdapter::end_line_impl((LineUpdaterStreamAdapter *)local_628);
    }
    local_688._0_1_ = (byte)local_688 & local_695;
    if ((byte)local_688 != 0) {
      LineUpdaterStreamAdapter::~LineUpdaterStreamAdapter((LineUpdaterStreamAdapter *)local_628);
      pTVar6 = local_670.
               super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pTVar8 = local_670.
                    super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
                    ._M_impl.super__Vector_impl_data._M_start; pTVar8 != pTVar6; pTVar8 = pTVar8 + 1
          ) {
        std::thread::join();
      }
      histogram<long,_true>::histogram
                ((histogram<long,_true> *)local_628,"spawned by i-th thread",0x19,8);
      local_688 = (EasyRandom *)local_218;
      histogram<long,_true>::histogram
                ((histogram<long,_true> *)local_688,"exceptions_during_puts",0x19,8);
      __n = (pointer)0x8;
      histogram<long,_true>::histogram
                ((histogram<long,_true> *)local_3b8,"exceptions_during_consumes",0x19,8);
      pQVar3 = local_690;
      std::
      vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::PutTypeCounters>_>
      ::vector((vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::PutTypeCounters>_>
                *)&local_650,*(long *)(local_690 + 0x48) - *(long *)(local_690 + 0x40) >> 3,
               (allocator_type *)&local_658);
      local_638 = 0;
      uStack_630 = 0;
      __args = extraout_RDX;
      pQVar1 = local_690;
      plVar2 = local_650;
      if (*(long *)(pQVar3 + 0xa0) != 0) {
        local_688 = (EasyRandom *)((long)local_688 + 0x178);
        uVar13 = 0;
        do {
          pTVar8 = local_670.
                   super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pTVar6 = local_670.
                   super__Vector_base<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar13;
          FinalStats::operator+=((FinalStats *)&local_650,&pTVar6->m_final_stats);
          __args = pTVar8[uVar13].m_final_stats.m_counters.
                   super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_658 = 0;
          for (__n = (pTVar6->m_final_stats).m_counters.
                     super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                     ._M_impl.super__Vector_impl_data._M_start; __n != __args; __n = __n + 1) {
            local_658 = local_658 + __n->m_spawned;
          }
          if (local_4a8._M_current == local_4a0) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_4b0,local_4a8,&local_658);
            __args = extraout_RDX_00;
          }
          else {
            *local_4a8._M_current = local_658;
            local_4a8._M_current = local_4a8._M_current + 1;
          }
          if ((local_67c & eTestExceptions) != eNone) {
            __args = (pointer)&pTVar8[uVar13].m_final_stats.m_exceptions_during_puts;
            if (local_98._M_current == local_90) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)local_688,local_98,(long *)__args);
              __args = extraout_RDX_01;
            }
            else {
              *local_98._M_current = *(long *)__args;
              local_98._M_current = local_98._M_current + 1;
            }
            __args_00 = &pTVar8[uVar13].m_final_stats.m_exceptions_during_consumes;
            if (local_238._M_current == local_230) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_240,local_238,__args_00);
              __args = extraout_RDX_02;
            }
            else {
              *local_238._M_current = *__args_00;
              local_238._M_current = local_238._M_current + 1;
            }
          }
          uVar13 = uVar13 + 1;
          pQVar1 = local_690;
          plVar2 = local_650;
        } while (uVar13 < *(ulong *)(local_690 + 0xa0));
      }
      for (; local_690 = pQVar1, plVar2 != local_648; plVar2 = plVar2 + 2) {
        if (*plVar2 != 0) {
          detail::assert_failed<>
                    ("counter.m_existing == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
                     ,0x114);
          __args = extraout_RDX_03;
        }
        pQVar1 = local_690;
      }
      histogram<long,_true>::write
                ((histogram<long,_true> *)local_628,(int)*(undefined8 *)pQVar1,__args,(size_t)__n);
      if ((local_67c & eTestExceptions) != eNone) {
        histogram<long,_true>::write
                  ((histogram<long,_true> *)local_218,(int)*(undefined8 *)pQVar1,__buf,(size_t)__n);
        histogram<long,_true>::write
                  ((histogram<long,_true> *)local_3b8,(int)*(undefined8 *)pQVar1,__buf_00,
                   (size_t)__n);
      }
      if (local_650 != (long *)0x0) {
        operator_delete(local_650);
      }
      if (local_240 != (pointer)0x0) {
        operator_delete(local_240);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
      std::ios_base::~ios_base((ios_base *)(local_3b8 + 0x70));
      if (local_a0 != (pointer)0x0) {
        operator_delete(local_a0);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
      std::ios_base::~ios_base((ios_base *)(local_218 + 0x70));
      if (local_4b0 != (pointer)0x0) {
        operator_delete(local_4b0);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
      std::ios_base::~ios_base((ios_base *)(local_628 + 0x70));
      std::
      vector<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData,_density_tests::aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>::ThreadData>_>
      ::~vector(&local_670);
      density::
      sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::~sp_heter_queue((sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                         *)&local_480.__data);
      return;
    }
    local_3b8._0_8_ = 0;
    local_3b8._8_8_ = 200000000;
    do {
      iVar4 = nanosleep((timespec *)local_3b8,(timespec *)local_3b8);
      if (iVar4 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
  } while( true );
}

Assistant:

void
          run_impl(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            auto const case_count = m_element_types.size();
            DENSITY_TEST_ASSERT(
              m_put_cases.size() == case_count && m_consume_cases.size() == case_count &&
              m_reentrant_put_cases.size() == case_count &&
              m_reentrant_consume_cases.size() == case_count);

            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            QUEUE queue;

            /* prepare the array of threads. The initialization of the random generator
                may take some time, so we do it before starting the threads. */
            aligned_vector<ThreadData> threads;
            FeedBack                   feedback;
            threads.reserve(m_thread_count);
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                threads.emplace_back(*this, &feedback, queue, i_random, i_flags);
            }

            uint64_t const num_of_processors = get_num_of_processors();
            bool const     reserve_core1_to_main =
              (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;

            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                uint64_t thread_affinity  = std::numeric_limits<uint64_t>::max();
                size_t   thread_put_count = 0, thread_consume_count = 0;

                if (reserve_core1_to_main)
                    thread_affinity -= 2;

                auto concurrent_puts     = QUEUE::concurrent_puts;
                auto concurrent_consumes = QUEUE::concurrent_consumes;

                if (concurrent_puts)
                {
                    // distribute the puts to the threads - the first thread gets the remainder
                    thread_put_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_put_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow puts only to the first thread, and reserve the first core to it
                    if (thread_index == 0)
                    {
                        thread_put_count = i_target_put_count;
                        thread_affinity  = 1;
                    }
                    else
                    {
                        thread_affinity ^= 1;
                    }
                }

                if (concurrent_consumes)
                {
                    // distribute the consumes to the threads - the first thread gets the remainder
                    thread_consume_count = i_target_put_count / m_thread_count;
                    if (thread_index == 0)
                        thread_consume_count += i_target_put_count % m_thread_count;
                }
                else
                {
                    // allow consumes only to the first thread, and reserve the last core to it
                    if (thread_index == m_thread_count - 1)
                    {
                        thread_consume_count = i_target_put_count;
                        thread_affinity      = uint64_t(1) << (num_of_processors - 1);
                    }
                    else
                    {
                        thread_affinity ^= uint64_t(1) << (num_of_processors - 1);
                    }
                }

                if (num_of_processors <= 1)
                    thread_affinity = std::numeric_limits<uint64_t>::max();

                threads[thread_index].start(
                  thread_index, thread_put_count, thread_consume_count, thread_affinity);
            }

            // wait for the test to be completed
            {
                LineUpdaterStreamAdapter line(m_output);
                bool                     complete = false;
                Progress                 progress(i_target_put_count);
                while (!complete)
                {
                    size_t produced = 0, consumed = 0;
                    size_t active_threads = 0;
                    for (auto & thread : threads)
                    {
                        produced += thread.incremental_stats().m_produced.load();
                        consumed += thread.incremental_stats().m_consumed.load();
                        active_threads +=
                          thread.incremental_stats().m_thread_is_active.load() ? 1 : 0;
                    }
                    DENSITY_TEST_ASSERT(
                      consumed <= i_target_put_count && produced <= i_target_put_count);
                    complete = consumed >= i_target_put_count && produced >= i_target_put_count;

                    bool too_many_enqueued = false;
                    if (produced > consumed)
                    {
                        double const enqueued_ratio =
                          static_cast<double>(produced - consumed) / static_cast<double>(consumed);
                        too_many_enqueued = enqueued_ratio > 0.2;
                    }
                    feedback.m_too_many_enqueued.store(
                      too_many_enqueued, std::memory_order_relaxed);

                    if (i_flags && QueueTesterFlags::ePrintProgress)
                    {
                        auto const enqueued = produced >= consumed ? (produced - consumed) : 0;
                        progress.set_progress(consumed);
                        line << "Active threads: " << active_threads << ", Consumed: " << consumed
                             << " (" << progress << "), enqueued: " << enqueued << std::endl;
                    }

                    if (!complete)
                    {
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    }
                }
            }

            for (auto & thread : threads)
            {
                thread.join();
            }

            histogram<int64_t> histogram_spawned("spawned by i-th thread");
            histogram<int64_t> histogram_except_puts("exceptions_during_puts");
            histogram<int64_t> histogram_except_cons("exceptions_during_consumes");

            FinalStats final_state(m_put_cases.size());
            for (size_t thread_index = 0; thread_index < m_thread_count; thread_index++)
            {
                auto const & thread_state = threads[thread_index].final_stats();
                final_state += thread_state;

                auto const spawned = std::accumulate(
                  thread_state.m_counters.begin(),
                  thread_state.m_counters.end(),
                  static_cast<int64_t>(0),
                  [](int64_t i_sum, const PutTypeCounters & i_counter) {
                      return i_sum + i_counter.m_spawned;
                  });
                histogram_spawned << spawned;

                if (with_exceptions)
                {
                    histogram_except_puts << thread_state.m_exceptions_during_puts;
                    histogram_except_cons << thread_state.m_exceptions_during_consumes;
                }
            }

            for (auto const & counter : final_state.m_counters)
            {
                DENSITY_TEST_ASSERT(counter.m_existing == 0);
            }

            m_output << histogram_spawned;
            if (with_exceptions)
            {
                m_output << histogram_except_puts;
                m_output << histogram_except_cons;
            }
        }